

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O0

bool Kumu::GetXMLDocType(byte_t *buf,ui32_t buf_len,string *ns_prefix,string *type_name,
                        string *namespace_name,AttributeList *doc_attr_list)

{
  bool bVar1;
  XMLNamespace *this;
  string *psVar2;
  AttributeList *__x;
  XMLNamespace *ns;
  undefined1 local_c0 [8];
  XMLElement tmp_element;
  AttributeList *doc_attr_list_local;
  string *namespace_name_local;
  string *type_name_local;
  string *ns_prefix_local;
  ui32_t buf_len_local;
  byte_t *buf_local;
  
  tmp_element.m_Body.field_2._8_8_ = doc_attr_list;
  XMLElement::XMLElement((XMLElement *)local_c0,"tmp");
  bVar1 = XMLElement::ParseFirstFromString((XMLElement *)local_c0,(char *)buf,buf_len);
  if (bVar1) {
    this = XMLElement::Namespace((XMLElement *)local_c0);
    if (this != (XMLNamespace *)0x0) {
      psVar2 = XMLNamespace::Prefix_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)ns_prefix,(string *)psVar2);
      psVar2 = XMLNamespace::Name_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)namespace_name,(string *)psVar2);
    }
    psVar2 = XMLElement::GetName_abi_cxx11_((XMLElement *)local_c0);
    std::__cxx11::string::operator=((string *)type_name,(string *)psVar2);
    __x = XMLElement::GetAttributes_abi_cxx11_((XMLElement *)local_c0);
    std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::operator=
              ((list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_> *)tmp_element.m_Body.field_2._8_8_
               ,__x);
    buf_local._7_1_ = true;
  }
  else {
    buf_local._7_1_ = false;
  }
  XMLElement::~XMLElement((XMLElement *)local_c0);
  return buf_local._7_1_;
}

Assistant:

bool
Kumu::GetXMLDocType(const byte_t* buf, ui32_t buf_len, std::string& ns_prefix, std::string& type_name, std::string& namespace_name,
		    AttributeList& doc_attr_list)
{
  XMLElement tmp_element("tmp");

  if ( ! tmp_element.ParseFirstFromString((const char*)buf, buf_len) )
    {
      return false;
    }

  const XMLNamespace* ns = tmp_element.Namespace();

  if ( ns != 0 )
    {
      ns_prefix = ns->Prefix();
      namespace_name = ns->Name();
    }

  type_name = tmp_element.GetName();
  doc_attr_list = tmp_element.GetAttributes();
  return true;
}